

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PermutazioneST.cpp
# Opt level: O2

void __thiscall
PermutazioneST::randomBS
          (PermutazioneST *this,PermutazioneST *p,uint limiteTrasposizioni,unsigned_short *risultato
          )

{
  ushort uVar1;
  ushort uVar2;
  unsigned_short *puVar3;
  uint uVar4;
  void *pvVar5;
  ushort uVar6;
  ushort uVar7;
  uint uVar8;
  ulong uVar9;
  ushort uVar10;
  ulong uVar11;
  PermutazioneST pCopia;
  
  PermutazioneST(&pCopia,(p->super_Permutazione).individuo,(p->super_Permutazione).dimensione);
  uVar10 = (p->super_Permutazione).dimensione;
  pvVar5 = operator_new__(-(ulong)(uVar10 == 0) | (ulong)uVar10 * 2 - 2);
  puVar3 = (p->super_Permutazione).individuo;
  uVar6 = 1;
  if (1 < uVar10) {
    uVar6 = uVar10;
  }
  uVar10 = 0;
  for (uVar9 = 0; uVar6 - 1 != uVar9; uVar9 = uVar9 + 1) {
    if (puVar3[uVar9 + 1] < puVar3[uVar9]) {
      uVar11 = (ulong)uVar10;
      uVar10 = uVar10 + 1;
      *(short *)((long)pvVar5 + uVar11 * 2) = (short)uVar9;
    }
  }
  for (uVar9 = 0; (uVar10 != 0 && (uVar9 < limiteTrasposizioni)); uVar9 = uVar9 + 1) {
    uVar4 = Random::randIntU(&genRand,0,uVar10 - 1);
    uVar6 = *(ushort *)((long)pvVar5 + (ulong)(uVar4 & 0xffff) * 2);
    uVar8 = uVar6 + 1;
    uVar7 = uVar10 - 1;
    risultato[uVar9] = uVar6;
    uVar1 = pCopia.super_Permutazione.individuo[uVar6];
    uVar2 = pCopia.super_Permutazione.individuo[uVar8];
    pCopia.super_Permutazione.individuo[uVar6] = uVar2;
    pCopia.super_Permutazione.individuo[uVar8] = uVar1;
    *(undefined2 *)((long)pvVar5 + (ulong)(uVar4 & 0xffff) * 2) =
         *(undefined2 *)((long)pvVar5 + (ulong)uVar7 * 2);
    if (uVar6 != 0) {
      uVar4 = uVar6 - 1;
      if ((uVar2 < pCopia.super_Permutazione.individuo[uVar4]) &&
         (pCopia.super_Permutazione.individuo[uVar4] < uVar1)) {
        *(short *)((long)pvVar5 + (ulong)uVar7 * 2) = (short)uVar4;
        uVar7 = uVar10;
      }
    }
    uVar10 = uVar7;
    if (((uVar6 + 2 < (uint)(p->super_Permutazione).dimensione) &&
        (pCopia.super_Permutazione.individuo[(ulong)uVar6 + 2] < uVar1)) &&
       (uVar2 < pCopia.super_Permutazione.individuo[(ulong)uVar6 + 2])) {
      uVar10 = uVar7 + 1;
      *(short *)((long)pvVar5 + (ulong)uVar7 * 2) = (short)uVar8;
    }
  }
  operator_delete__(pvVar5);
  Permutazione::~Permutazione(&pCopia.super_Permutazione);
  return;
}

Assistant:

void PermutazioneST::randomBS(PermutazioneST& p, unsigned int limiteTrasposizioni, unsigned short* risultato) {

	PermutazioneST pCopia(p.individuo, p.dimensione);

	unsigned short* zeta = new unsigned short[p.dimensione - 1];
	unsigned short cursoreZeta = 0;

	unsigned int cursoreTrasposizioni = 0;
	unsigned int contatoreTrasposizioni = 0;

	for (unsigned short i = 0; i < p.dimensione - 1; i++) {
		if (p.individuo[i] > p.individuo[i + 1])
			zeta[cursoreZeta++] = i;
	}

	unsigned short random, randomZeta, temp;

	while (cursoreZeta > 0 && contatoreTrasposizioni < limiteTrasposizioni) {

		random = genRand.randIntU(0, cursoreZeta - 1);
		randomZeta = zeta[random];

		risultato[contatoreTrasposizioni++] = randomZeta;


		temp = pCopia.individuo[randomZeta];
		pCopia.individuo[randomZeta] = pCopia.individuo[randomZeta + 1];
		pCopia.individuo[randomZeta + 1] = temp;

		zeta[random] = zeta[--cursoreZeta];

		if (randomZeta > 0 && pCopia.individuo[randomZeta - 1] > pCopia.individuo[randomZeta] &&
			pCopia.individuo[randomZeta - 1] < pCopia.individuo[randomZeta + 1])
			zeta[cursoreZeta++] = randomZeta - 1;

		if (randomZeta + 2 < p.dimensione && pCopia.individuo[randomZeta + 1] > pCopia.individuo[randomZeta + 2] &&
			pCopia.individuo[randomZeta] < pCopia.individuo[randomZeta + 2])
			zeta[cursoreZeta++] = randomZeta + 1;

	}

	delete[] zeta;
}